

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derOIDDec2(octet *der,size_t count,char *oid)

{
  size_t sVar1;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  size_t oid_delta;
  size_t pos;
  size_t len;
  u32 val;
  u32 d1;
  u32 in_stack_ffffffffffffffbc;
  size_t in_stack_ffffffffffffffc0;
  octet *in_stack_ffffffffffffffc8;
  size_t *psVar2;
  size_t *in_stack_ffffffffffffffd0;
  uint val_00;
  int iVar3;
  u32 val_01;
  char *local_20;
  size_t local_8;
  
  iVar3 = 3;
  val_00 = 0;
  if (in_RSI == -1) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    local_8 = derDec2((octet **)0x300000000,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                      in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    if (local_8 == 0xffffffffffffffff) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      local_20 = in_RDX;
      for (psVar2 = (size_t *)0x0; psVar2 < in_stack_ffffffffffffffd0;
          psVar2 = (size_t *)((long)psVar2 + 1)) {
        if ((val_00 & 0xfe000000) != 0) {
          return 0xffffffffffffffff;
        }
        if ((val_00 == 0) && (*(char *)(in_RDI + (long)psVar2) == -0x80)) {
          return 0xffffffffffffffff;
        }
        val_00 = val_00 << 7 | *(byte *)(in_RDI + (long)psVar2) & 0x7f;
        if ((*(byte *)(in_RDI + (long)psVar2) & 0x80) == 0) {
          if (iVar3 == 3) {
            if (val_00 < 0x28) {
              val_01 = 0;
            }
            else if (val_00 < 0x50) {
              val_01 = 1;
              val_00 = val_00 - 0x28;
            }
            else {
              val_01 = 2;
              val_00 = val_00 - 0x50;
            }
            sVar1 = derSIDDec2(val_01,local_20);
            if (sVar1 == 0xffffffffffffffff) {
              return 0xffffffffffffffff;
            }
            local_20 = local_20 + sVar1;
            iVar3 = 0;
          }
          if (*local_20 != '.') {
            return 0xffffffffffffffff;
          }
          sVar1 = derSIDDec2(val_00,local_20 + 1);
          if (sVar1 == 0xffffffffffffffff) {
            return 0xffffffffffffffff;
          }
          local_20 = local_20 + 1 + sVar1;
          val_00 = 0;
        }
      }
      if (*local_20 != '\0') {
        local_8 = 0xffffffffffffffff;
      }
    }
  }
  return local_8;
}

Assistant:

size_t derOIDDec2(const octet der[], size_t count, const char* oid)
{
	u32 d1 = 3;
	u32 val = 0;
	size_t len, pos, oid_delta;
	// проверить входной буфер
	if (count == SIZE_MAX)
		return SIZE_MAX;
	ASSERT(memIsValid(der, count));
	// проверить тег и определить значение
	count = derDec2(&der, &len, der, count, 0x06);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// обработать sid
	for (pos = 0; pos < len; ++pos)
	{
		// переполнение?
		if (val & 0xFE000000)
			return SIZE_MAX;
		// лидирующий 0?
		if (val == 0 && der[pos] == 128)
			return SIZE_MAX;
		// обработать октет sid
		val <<= 7, val |= (size_t)der[pos] & 127;
		// последний октет sid?
		if ((der[pos] & 128) == 0)
		{
			// первый sid?
			if (d1 == 3)
			{
				if (val < 40)
					d1 = 0;
				else if (val < 80)
					d1 = 1, val -= 40;
				else
					d1 = 2, val -= 80;
				oid_delta = derSIDDec2(d1, oid);
				if (oid_delta == SIZE_MAX)
					return SIZE_MAX;
				oid += oid_delta, d1 = 0;
			}
			// добавить ".val"
			if (*oid != '.')
				return SIZE_MAX;
			++oid;
			oid_delta = derSIDDec2(val, oid);
			if (oid_delta == SIZE_MAX)
				return SIZE_MAX;
			// к следующему sid
			oid += oid_delta, val = 0;
		}
	}
	// очистка и выход
	d1 = val = 0, pos = len = 0;
	if (*oid != '\0')
		return SIZE_MAX;
	return count;
}